

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O0

GenericContainer * __thiscall
avro::GenericContainer::operator=(GenericContainer *this,GenericContainer *param_2)

{
  shared_ptr<avro::Node> *in_RDI;
  shared_ptr<avro::Node> *unaff_retaddr;
  
  boost::shared_ptr<avro::Node>::operator=(unaff_retaddr,in_RDI);
  return (GenericContainer *)in_RDI;
}

Assistant:

class AVRO_DECL GenericContainer {
    NodePtr schema_;
    static void assertType(const NodePtr& schema, Type type);
protected:
    /**
     * Constructs a container corresponding to the given schema.
     */
    GenericContainer(Type type, const NodePtr& s) : schema_(s) {
        assertType(s, type);
    }